

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O3

UMutableCPTrie * umutablecptrie_fromUCPTrie_63(UCPTrie *trie,UErrorCode *pErrorCode)

{
  char cVar1;
  uint end;
  MutableCodePointTrie *this;
  MutableCodePointTrie *pMVar2;
  uint iniValue;
  UErrorCode *p;
  uint32_t errValue;
  uint start;
  MutableCodePointTrie *this_00;
  uint32_t local_34;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UMutableCPTrie *)0x0;
  }
  if (trie == (UCPTrie *)0x0) {
LAB_001bf8cd:
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UMutableCPTrie *)0x0;
  }
  cVar1 = trie->valueWidth;
  if (cVar1 == '\x02') {
    errValue = (uint32_t)*(byte *)((long)(trie->data).ptr0 + (long)trie->dataLength + -1);
    iniValue = (uint)*(byte *)((long)(trie->data).ptr0 + (long)trie->dataLength + -2);
  }
  else if (cVar1 == '\x01') {
    iniValue = *(uint *)((long)(trie->data).ptr0 + (long)trie->dataLength * 4 + -8);
    errValue = *(uint32_t *)((long)(trie->data).ptr0 + (long)trie->dataLength * 4 + -4);
  }
  else {
    if (cVar1 != '\0') goto LAB_001bf8cd;
    errValue = (uint32_t)*(ushort *)((long)(trie->data).ptr0 + (long)trie->dataLength * 2 + -2);
    iniValue = (uint)*(ushort *)((long)(trie->data).ptr0 + (long)trie->dataLength * 2 + -4);
  }
  p = pErrorCode;
  this = (MutableCodePointTrie *)
         icu_63::UMemory::operator_new((UMemory *)0x11040,(size_t)pErrorCode);
  if (this == (MutableCodePointTrie *)0x0) {
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    this = (MutableCodePointTrie *)0x0;
LAB_001bf9a1:
    this_00 = (MutableCodePointTrie *)0x0;
    pMVar2 = this;
  }
  else {
    p = (UErrorCode *)(ulong)iniValue;
    icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
              (this,iniValue,errValue,pErrorCode);
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      start = 0;
      while( true ) {
        p = (UErrorCode *)(ulong)start;
        end = ucptrie_getRange_63(trie,start,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                  (void *)0x0,&local_34);
        if ((int)end < 0) break;
        if (local_34 != iniValue) {
          if (start == end) {
            icu_63::anon_unknown_0::MutableCodePointTrie::set(this,start,local_34,pErrorCode);
          }
          else {
            icu_63::anon_unknown_0::MutableCodePointTrie::setRange
                      (this,start,end,local_34,pErrorCode);
          }
        }
        start = end + 1;
      }
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_001bf9a1;
    }
    icu_63::anon_unknown_0::MutableCodePointTrie::~MutableCodePointTrie(this);
    pMVar2 = (MutableCodePointTrie *)0x0;
    this_00 = this;
  }
  icu_63::UMemory::operator_delete((UMemory *)this_00,p);
  return (UMutableCPTrie *)pMVar2;
}

Assistant:

int32_t getAllSameOverlap(const uint32_t *p, int32_t length, uint32_t value,
                          int32_t blockLength) {
    int32_t min = length - (blockLength - 1);
    int32_t i = length;
    while (min < i && p[i - 1] == value) { --i; }
    return length - i;
}